

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * compatibilityType_abi_cxx11_(string *__return_storage_ptr__,CompatibleType t)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(t) {
  case BoolType:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Boolean compatibility";
    pcVar1 = "";
    break;
  case StringType:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "String compatibility";
    pcVar1 = "";
    break;
  case NumberMinType:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Numeric minimum compatibility";
    pcVar1 = "";
    break;
  case NumberMaxType:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Numeric maximum compatibility";
    pcVar1 = "";
    break;
  default:
    __assert_fail("false && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x1724,"std::string compatibilityType(CompatibleType)");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string compatibilityType(CompatibleType t)
{
  switch (t) {
    case BoolType:
      return "Boolean compatibility";
    case StringType:
      return "String compatibility";
    case NumberMaxType:
      return "Numeric maximum compatibility";
    case NumberMinType:
      return "Numeric minimum compatibility";
  }
  assert(false && "Unreachable!");
  return "";
}